

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O1

_Bool effect_handler_CREATE_STAIRS(effect_handler_context_t_conflict *context)

{
  loc grid;
  loc grid_00;
  loc grid_01;
  loc grid_02;
  _Bool _Var1;
  object *poVar2;
  char *fmt;
  
  context->ident = true;
  grid.x = (player->grid).x;
  grid.y = (player->grid).y;
  _Var1 = square_isfloor(cave,grid);
  if (_Var1) {
    if (((player->opts).opt[0x2b] == false) && (player->upkeep->arena_level != true)) {
      grid_00.x = (player->grid).x;
      grid_00.y = (player->grid).y;
      poVar2 = square_object(cave,grid_00);
      if (poVar2 != (object *)0x0) {
        grid_01.x = (player->grid).x;
        grid_01.y = (player->grid).y;
        push_object(grid_01);
      }
      grid_02.x = (player->grid).x;
      grid_02.y = (player->grid).y;
      square_add_stairs(cave,grid_02,(int)player->depth);
      return true;
    }
    fmt = "Nothing happens!";
  }
  else {
    fmt = "There is no empty floor here.";
  }
  msg(fmt);
  return false;
}

Assistant:

bool effect_handler_CREATE_STAIRS(effect_handler_context_t *context)
{
	context->ident = true;

	/* Only allow stairs to be created on empty floor */
	if (!square_isfloor(cave, player->grid)) {
		msg("There is no empty floor here.");
		return false;
	}

	/* Fails for persistent levels (for now) and arenas */
	if (OPT(player, birth_levels_persist) || player->upkeep->arena_level) {
		msg("Nothing happens!");
		return false;
	}

	/* Push objects off the grid */
	if (square_object(cave, player->grid))
		push_object(player->grid);

	square_add_stairs(cave, player->grid, player->depth);

	return true;
}